

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O1

void __thiscall
midi_container::serialize_as_stream
          (midi_container *this,unsigned_long subsong,
          vector<midi_stream_event,_std::allocator<midi_stream_event>_> *p_stream,
          system_exclusive_table *p_system_exclusive,unsigned_long *loop_start,
          unsigned_long *loop_end,uint clean_flags)

{
  byte *pbVar1;
  char cVar2;
  pointer pmVar3;
  pointer pmVar4;
  pointer pvVar5;
  char *pcVar6;
  pointer pcVar7;
  size_type sVar8;
  pointer puVar9;
  pointer puVar10;
  bool bVar11;
  int iVar12;
  pointer *ppmVar13;
  ulong uVar14;
  ulong uVar15;
  ulong __new_size;
  int iVar16;
  long lVar17;
  ulong uVar18;
  unsigned_long uVar19;
  ulong uVar20;
  ulong *puVar21;
  ulong *puVar22;
  size_type __new_size_00;
  iterator __position;
  byte bVar23;
  long lVar24;
  ulong uVar25;
  uchar uVar26;
  size_type sVar27;
  long lVar28;
  undefined8 *puVar29;
  size_t sVar30;
  bool bVar31;
  vector<unsigned_char,_std::allocator<unsigned_char>_> port_numbers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  device_names;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_long,_std::allocator<unsigned_long>_> track_positions;
  midi_stream_event local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  ulong local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  ulong *local_c0;
  unsigned_long local_b8;
  unsigned_long local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  unsigned_long local_88;
  pointer local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  unsigned_long *local_60;
  unsigned_long *local_58;
  long local_50;
  system_exclusive_table *local_48;
  unsigned_long local_40;
  unsigned_long local_38;
  
  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pmVar3 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_80 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_start;
  __new_size = ((long)pmVar3 - (long)local_80 >> 3) * -0x5555555555555555;
  uVar19 = 0;
  if (this->m_form == 2) {
    uVar19 = subsong;
  }
  local_38 = (this->m_timestamp_loop_start).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar19];
  local_40 = (this->m_timestamp_loop_end).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar19];
  local_108.m_timestamp = 0;
  local_60 = loop_start;
  local_58 = loop_end;
  local_48 = p_system_exclusive;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&local_78,__new_size,&local_108.m_timestamp);
  local_108.m_timestamp = local_108.m_timestamp & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&local_f8,__new_size,(value_type *)&local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&local_d8,__new_size);
  if (pmVar3 != local_80 && (clean_flags & 1) != 0) {
    pmVar4 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = 0;
    do {
      lVar24 = *(long *)&pmVar4[uVar14].m_events.
                         super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
      lVar17 = (long)*(pointer *)
                      ((long)&pmVar4[uVar14].m_events.
                              super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl +
                      8) - lVar24;
      if (lVar17 != 0) {
        uVar18 = lVar17 >> 6;
        bVar31 = false;
        uVar15 = 1;
        uVar20 = 0;
        do {
          uVar25 = uVar15;
          lVar17 = uVar20 * 0x40;
          if ((((*(int *)(lVar24 + 8 + lVar17) == 3) && (*(char *)(lVar24 + 0x18 + lVar17) == 'n'))
              && (bVar23 = *(byte *)(lVar17 + lVar24 + 0x19), 1 < bVar23)) && (bVar23 != 0x7f)) {
            bVar11 = false;
            bVar31 = true;
          }
          else {
            bVar11 = true;
          }
        } while ((bVar11) && (uVar15 = (ulong)((int)uVar25 + 1), uVar20 = uVar25, uVar25 < uVar18));
        if (bVar31) {
          local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar14] = uVar18;
        }
      }
      uVar14 = uVar14 + 1;
    } while ((uVar14 & 0xffffffff) <= __new_size && __new_size - (uVar14 & 0xffffffff) != 0);
  }
  if (pmVar3 != local_80 && this->m_form == 2) {
    ppmVar13 = (pointer *)
               ((long)&(((this->m_tracks).
                         super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
                         super__Vector_impl_data._M_start)->m_events).
                       super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl + 8);
    uVar19 = 0;
    do {
      if (subsong != uVar19) {
        local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar19] =
             (long)*ppmVar13 - (long)((_Vector_impl_data *)(ppmVar13 + -1))->_M_start >> 6;
      }
      uVar19 = uVar19 + 1;
      ppmVar13 = ppmVar13 + 3;
    } while (__new_size + (__new_size == 0) != uVar19);
  }
  local_b0 = 0xffffffffffffffff;
  local_b8 = 0xffffffffffffffff;
  do {
    if (pmVar3 == local_80) {
      bVar31 = true;
      uVar14 = 0;
    }
    else {
      ppmVar13 = (pointer *)
                 ((long)&(((this->m_tracks).
                           super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
                           super__Vector_impl_data._M_start)->m_events).
                         super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl + 8);
      uVar15 = 0xffffffffffffffff;
      uVar20 = 0;
      uVar14 = 0;
      do {
        if ((local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar20] <
             (ulong)((long)*ppmVar13 - (long)((_Vector_impl_data *)(ppmVar13 + -1))->_M_start >> 6))
           && (uVar18 = ((_Vector_impl_data *)(ppmVar13 + -1))->_M_start
                        [local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar20]].m_timestamp,
              uVar18 < uVar15)) {
          uVar15 = uVar18;
          uVar14 = uVar20;
        }
        uVar20 = uVar20 + 1;
        ppmVar13 = ppmVar13 + 3;
      } while ((uVar20 & 0xffffffff) <= __new_size && __new_size - (uVar20 & 0xffffffff) != 0);
      bVar31 = uVar15 == 0xffffffffffffffff;
    }
    if (!bVar31) {
      if ((clean_flags & 6) == 0) {
LAB_00105a3b:
        uVar19 = 0;
        if (this->m_form == 2) {
          uVar19 = subsong;
        }
        puVar21 = (ulong *)(local_78.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar14] * 0x40 +
                           *(long *)&(this->m_tracks).
                                     super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                                     _M_impl.super__Vector_impl_data._M_start[uVar14].m_events.
                                     super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                                     _M_impl);
        if ((local_b8 == 0xffffffffffffffff) &&
           (local_b8 = 0xffffffffffffffff, local_38 <= *puVar21)) {
          local_b8 = *(long *)(p_stream + 8) - *(long *)p_stream >> 4;
        }
        if ((local_b0 == 0xffffffffffffffff) && (local_b0 = 0xffffffffffffffff, local_40 < *puVar21)
           ) {
          local_b0 = *(long *)(p_stream + 8) - *(long *)p_stream >> 4;
        }
        local_88 = timestamp_to_ms(this,*puVar21,uVar19);
        if ((int)puVar21[1] == 7) {
          uVar15 = (puVar21[2] + puVar21[6]) - puVar21[5];
          local_c0 = puVar21 + 3;
          bVar23 = (byte)puVar21[3];
          if (bVar23 == 0xf0 && 2 < uVar15) {
            lVar24 = uVar14 * 0x20;
            local_e0 = uVar15;
            if (local_d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length != 0) {
              pvVar5 = (this->m_device_names).
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar29 = *(undefined8 **)
                         &pvVar5[*(uint *)((long)puVar21 + 0xc)].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data;
              lVar17 = (long)*(pointer *)
                              ((long)&pvVar5[*(uint *)((long)puVar21 + 0xc)].
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data + 8) - (long)puVar29;
              if (lVar17 == 0) {
                uVar26 = '\0';
              }
              else {
                lVar17 = lVar17 >> 5;
                pcVar6 = local_d8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p;
                lVar17 = lVar17 + (ulong)(lVar17 == 0);
                lVar28 = 0;
                local_50 = lVar24;
                do {
                  iVar12 = strcmp((char *)*puVar29,pcVar6);
                  lVar24 = lVar28;
                  if (iVar12 == 0) break;
                  lVar28 = lVar28 + 1;
                  puVar29 = puVar29 + 4;
                  lVar24 = lVar17;
                } while (lVar17 != lVar28);
                uVar26 = (uchar)lVar24;
                lVar24 = local_50;
              }
              local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14] = uVar26;
              *(undefined8 *)
               ((long)&(local_d8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + lVar24) = 0;
              **(undefined1 **)
                ((long)&((local_d8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar24) =
                   0;
              puVar9 = (this->m_port_numbers).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar10 = (this->m_port_numbers).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if (puVar10 != puVar9) {
                uVar15 = 0;
                do {
                  if (puVar9[uVar15] ==
                      local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar14]) {
                    local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar14] = (uchar)uVar15;
                    break;
                  }
                  uVar15 = (ulong)((int)uVar15 + 1);
                } while (uVar15 < (ulong)((long)puVar10 - (long)puVar9));
              }
            }
            uVar15 = local_e0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_a8,local_e0);
            puVar9 = local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar20 = (puVar21[2] + puVar21[6]) - puVar21[5];
            if (uVar15 <= uVar20) {
              uVar20 = uVar15;
            }
            sVar30 = 0x10;
            if (uVar20 < 0x10) {
              sVar30 = uVar20;
            }
            memcpy(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,local_c0,sVar30);
            if (0x10 < uVar20) {
              memcpy(puVar9 + sVar30,(void *)puVar21[5],uVar20 - sVar30);
            }
            if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[local_e0 - 1] == 0xf7) {
              local_108.m_event =
                   system_exclusive_table::add_entry
                             (local_48,local_a8.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,local_e0,
                              (ulong)local_f8.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar14]);
              local_108.m_event = local_108.m_event | 0x80000000;
              local_108.m_timestamp = local_88;
              __position._M_current = *(midi_stream_event **)(p_stream + 8);
              if (__position._M_current != *(midi_stream_event **)(p_stream + 0x10))
              goto LAB_00105eeb;
              std::vector<midi_stream_event,_std::allocator<midi_stream_event>_>::
              _M_realloc_insert<midi_stream_event>(p_stream,__position,&local_108);
            }
          }
          else if (bVar23 == 0xff && 2 < uVar15) {
            cVar2 = *(char *)((long)puVar21 + 0x19);
            if (cVar2 == '\x04') {
LAB_00105c92:
              __new_size_00 = uVar15 - 2;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_a8,__new_size_00);
              puVar9 = local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar15 = ((puVar21[2] + puVar21[6]) - puVar21[5]) - 2;
              if (__new_size_00 <= uVar15) {
                uVar15 = __new_size_00;
              }
              sVar30 = 0xe;
              if (uVar15 < 0xe) {
                sVar30 = uVar15;
              }
              local_e0 = __new_size_00;
              memcpy(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,(void *)((long)puVar21 + 0x1a),sVar30)
              ;
              if (0xe < uVar15) {
                memcpy(puVar9 + sVar30,(void *)puVar21[5],uVar15 - sVar30);
              }
              local_d8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length = 0;
              *local_d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p = '\0';
              pcVar7 = local_d8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p;
              std::__cxx11::string::
              _M_replace_dispatch<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((string *)
                         (local_d8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar14),pcVar7,
                         pcVar7 + local_d8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length
                        );
              sVar8 = local_d8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length;
              if (sVar8 != 0) {
                pcVar7 = local_d8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p;
                sVar27 = 0;
                do {
                  iVar12 = tolower((int)pcVar7[sVar27]);
                  pcVar7[sVar27] = (char)iVar12;
                  sVar27 = sVar27 + 1;
                } while (sVar8 != sVar27);
              }
            }
            else if (cVar2 == '!') {
              local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14] = *(uchar *)((long)puVar21 + 0x1a);
              local_d8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length = 0;
              *local_d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p = '\0';
              puVar9 = (this->m_port_numbers).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar10 = (this->m_port_numbers).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if (puVar10 != puVar9) {
                uVar15 = 0;
                do {
                  if (puVar9[uVar15] ==
                      local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar14]) {
                    local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar14] = (uchar)uVar15;
                    break;
                  }
                  uVar15 = (ulong)((int)uVar15 + 1);
                } while (uVar15 < (ulong)((long)puVar10 - (long)puVar9));
              }
            }
            else if (cVar2 == '\t') goto LAB_00105c92;
          }
          else if (0xf7 < bVar23 && uVar15 == 1) {
            if (local_d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length != 0) {
              pvVar5 = (this->m_device_names).
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar29 = *(undefined8 **)
                         &pvVar5[*(uint *)((long)puVar21 + 0xc)].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data;
              lVar24 = (long)*(pointer *)
                              ((long)&pvVar5[*(uint *)((long)puVar21 + 0xc)].
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data + 8) - (long)puVar29;
              if (lVar24 == 0) {
                uVar26 = '\0';
              }
              else {
                lVar24 = lVar24 >> 5;
                pcVar6 = local_d8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p;
                lVar24 = lVar24 + (ulong)(lVar24 == 0);
                lVar17 = 0;
                do {
                  iVar12 = strcmp((char *)*puVar29,pcVar6);
                  lVar28 = lVar17;
                  if (iVar12 == 0) break;
                  lVar17 = lVar17 + 1;
                  puVar29 = puVar29 + 4;
                  lVar28 = lVar24;
                } while (lVar24 != lVar17);
                uVar26 = (uchar)lVar28;
              }
              local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14] = uVar26;
              local_d8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length = 0;
              *local_d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p = '\0';
              puVar9 = (this->m_port_numbers).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar10 = (this->m_port_numbers).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if (puVar10 != puVar9) {
                uVar15 = 0;
                do {
                  if (puVar9[uVar15] ==
                      local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar14]) {
                    local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar14] = (uchar)uVar15;
                    break;
                  }
                  uVar15 = (ulong)((int)uVar15 + 1);
                } while (uVar15 < (ulong)((long)puVar10 - (long)puVar9));
              }
            }
            local_108.m_event =
                 (uint)(byte)*local_c0 |
                 (uint)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar14] << 0x18;
            local_108.m_timestamp = local_88;
            __position._M_current = *(midi_stream_event **)(p_stream + 8);
            if (__position._M_current != *(midi_stream_event **)(p_stream + 0x10))
            goto LAB_00105eeb;
            std::vector<midi_stream_event,_std::allocator<midi_stream_event>_>::
            _M_realloc_insert<midi_stream_event>(p_stream,__position,&local_108);
          }
        }
        else {
          puVar22 = (ulong *)(uVar14 * 0x20);
          if (local_d8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length != 0) {
            pvVar5 = (this->m_device_names).
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar29 = *(undefined8 **)
                       &pvVar5[*(uint *)((long)puVar21 + 0xc)].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data;
            lVar24 = (long)*(pointer *)
                            ((long)&pvVar5[*(uint *)((long)puVar21 + 0xc)].
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data + 8) - (long)puVar29;
            if (lVar24 == 0) {
              uVar26 = '\0';
            }
            else {
              lVar24 = lVar24 >> 5;
              pcVar6 = local_d8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p;
              lVar24 = lVar24 + (ulong)(lVar24 == 0);
              lVar17 = 0;
              local_c0 = puVar22;
              do {
                iVar12 = strcmp((char *)*puVar29,pcVar6);
                lVar28 = lVar17;
                if (iVar12 == 0) break;
                lVar17 = lVar17 + 1;
                puVar29 = puVar29 + 4;
                lVar28 = lVar24;
              } while (lVar24 != lVar17);
              uVar26 = (uchar)lVar28;
              puVar22 = local_c0;
            }
            local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar14] = uVar26;
            pbVar1 = (byte *)((long)&(local_d8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                             (long)puVar22);
            pbVar1[0] = 0;
            pbVar1[1] = 0;
            pbVar1[2] = 0;
            pbVar1[3] = 0;
            pbVar1[4] = 0;
            pbVar1[5] = 0;
            pbVar1[6] = 0;
            pbVar1[7] = 0;
            **(undefined1 **)
              ((long)&((local_d8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
              (long)puVar22) = 0;
            puVar9 = (this->m_port_numbers).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar10 = (this->m_port_numbers).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (puVar10 != puVar9) {
              uVar15 = 0;
              do {
                if (puVar9[uVar15] ==
                    local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar14]) {
                  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar14] = (uchar)uVar15;
                  break;
                }
                uVar15 = (ulong)((int)uVar15 + 1);
              } while (uVar15 < (ulong)((long)puVar10 - (long)puVar9));
            }
          }
          iVar12 = (uint)(byte)puVar21[3] << 8;
          if (puVar21[2] == 0) {
            iVar12 = 0;
          }
          iVar16 = (uint)*(byte *)((long)puVar21 + 0x19) << 0x10;
          if (puVar21[2] < 2) {
            iVar16 = 0;
          }
          local_108.m_event =
               (uint)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar14] * 0x1000000 +
               iVar16 + iVar12 + (int)puVar21[1] * 0x10 + *(int *)((long)puVar21 + 0xc) + 0x80;
          local_108.m_timestamp = local_88;
          __position._M_current = *(midi_stream_event **)(p_stream + 8);
          if (__position._M_current == *(midi_stream_event **)(p_stream + 0x10)) {
            std::vector<midi_stream_event,_std::allocator<midi_stream_event>_>::
            _M_realloc_insert<midi_stream_event>(p_stream,__position,&local_108);
          }
          else {
LAB_00105eeb:
            (__position._M_current)->m_timestamp = local_88;
            *(ulong *)&(__position._M_current)->m_event =
                 CONCAT44(local_108._12_4_,local_108.m_event);
            *(long *)(p_stream + 8) = *(long *)(p_stream + 8) + 0x10;
            local_108.m_timestamp = local_88;
          }
        }
      }
      else {
        lVar24 = *(long *)&(this->m_tracks).
                           super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar14].m_events.
                           super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
        iVar12 = *(int *)(lVar24 + 8 +
                         local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar14] * 0x40);
        bVar23 = iVar12 == 4 & (byte)clean_flags >> 1;
        if (((clean_flags & 4) == 0) || (bVar23 != 0)) {
          if (bVar23 == 0) goto LAB_00105a3b;
        }
        else if ((iVar12 != 3) ||
                ((*(byte *)(lVar24 + local_78.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar14] * 0x40 + 0x18
                           ) & 0xdf) != 0)) goto LAB_00105a3b;
      }
      local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar14] =
           local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar14] + 1;
    }
    if (bVar31) {
      *local_60 = local_b8;
      *local_58 = local_b0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d8);
      if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_f8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uint8_t *)0x0) {
        operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void midi_container::serialize_as_stream( unsigned long subsong,
                                          std::vector<midi_stream_event> & p_stream,
                                          system_exclusive_table & p_system_exclusive,
                                          unsigned long & loop_start,
                                          unsigned long & loop_end,
                                          unsigned clean_flags ) const
{
    std::vector<uint8_t> data;
    std::vector<std::size_t> track_positions;
    std::vector<uint8_t> port_numbers;
    std::vector<std::string> device_names;
    std::size_t track_count = m_tracks.size();

    unsigned long tick_loop_start = get_timestamp_loop_start(subsong);
    unsigned long tick_loop_end = get_timestamp_loop_end(subsong);
    unsigned long local_loop_start = ~0UL;
    unsigned long local_loop_end = ~0UL;

    track_positions.resize( track_count, 0 );
    port_numbers.resize( track_count, 0 );
    device_names.resize( track_count );

    bool clean_emidi = !!( clean_flags & clean_flag_emidi );
    bool clean_instruments = !!( clean_flags & clean_flag_instruments );
    bool clean_banks = !!( clean_flags & clean_flag_banks );

    if ( clean_emidi )
    {
        for ( unsigned i = 0; i < track_count; ++i )
        {
            bool skip_track = false;
            const midi_track & track = m_tracks[ i ];
            for ( unsigned j = 0; j < track.get_count(); ++j )
            {
                const midi_event & event = track[ j ];
                if ( event.m_type == midi_event::control_change &&
                     event.m_data[ 0 ] == 110 )
                {
                    if ( event.m_data[ 1 ] != 0 && event.m_data[ 1 ] != 1 && event.m_data[ 1 ] != 127 )
                    {
                        skip_track = true;
                        break;
                    }
                }
            }
            if ( skip_track )
            {
                track_positions[ i ] = track.get_count();
            }
        }
    }

    if ( m_form == 2 )
    {
        for ( unsigned long i = 0; i < track_count; ++i )
        {
            if ( i != subsong ) track_positions[ i ] = m_tracks[ i ].get_count();
        }
    }

    for (;;)
    {
        unsigned long next_timestamp = ~0UL;
        std::size_t next_track = 0;
        for ( unsigned i = 0; i < track_count; ++i )
        {
            if ( track_positions[ i ] >= m_tracks[ i ].get_count() ) continue;
            if ( m_tracks[ i ][ track_positions[ i ] ].m_timestamp < next_timestamp )
            {
                next_timestamp = m_tracks[ i ][ track_positions[ i ] ].m_timestamp;
                next_track = i;
            }
        }
        if ( next_timestamp == ~0UL ) break;

        bool filtered = false;

        if ( clean_instruments || clean_banks )
        {
            const midi_event & event = m_tracks[ next_track ][ track_positions[ next_track ] ];
            if ( clean_instruments && event.m_type == midi_event::program_change ) filtered = true;
            else if ( clean_banks && event.m_type == midi_event::control_change &&
                ( event.m_data[ 0 ] == 0x00 || event.m_data[ 0 ] == 0x20 ) ) filtered = true;
        }

        if ( !filtered )
        {
            unsigned long tempo_track = 0;
            if ( m_form == 2 && subsong ) tempo_track = subsong;

            const midi_event & event = m_tracks[ next_track ][ track_positions[ next_track ] ];

            if ( local_loop_start == ~0UL && event.m_timestamp >= tick_loop_start )
                local_loop_start = p_stream.size();
            if ( local_loop_end == ~0UL && event.m_timestamp > tick_loop_end )
                local_loop_end = p_stream.size();

            unsigned long timestamp_ms = timestamp_to_ms( event.m_timestamp, tempo_track );
            if ( event.m_type != midi_event::extended )
            {
                if ( device_names[ next_track ].length() )
                {
                    unsigned long i, j;
                    for ( i = 0, j = m_device_names[ event.m_channel ].size(); i < j; ++i )
                    {
                        if ( !strcmp( m_device_names[ event.m_channel ][ i ].c_str(), device_names[ next_track ].c_str() ) ) break;
                    }
                    port_numbers[ next_track ] = (uint8_t) i;
                    device_names[ next_track ].clear();
                    limit_port_number( port_numbers[ next_track ] );
                }

                uint32_t event_code = ( ( event.m_type + 8 ) << 4 ) + event.m_channel;
                if ( event.m_data_count >= 1 ) event_code += event.m_data[ 0 ] << 8;
                if ( event.m_data_count >= 2 ) event_code += event.m_data[ 1 ] << 16;
                event_code += port_numbers[ next_track ] << 24;
                p_stream.push_back( midi_stream_event( timestamp_ms, event_code ) );
            }
            else
            {
                std::size_t data_count = event.get_data_count();
                if ( data_count >= 3 && event.m_data[ 0 ] == 0xF0 )
                {
                    if ( device_names[ next_track ].length() )
                    {
                        unsigned long i, j;
                        for ( i = 0, j = m_device_names[ event.m_channel ].size(); i < j; ++i )
                        {
                            if ( !strcmp( m_device_names[ event.m_channel ][ i ].c_str(), device_names[ next_track ].c_str() ) ) break;
                        }
                        port_numbers[ next_track ] = (uint8_t) i;
                        device_names[ next_track ].clear();
                        limit_port_number( port_numbers[ next_track ] );
                    }

                    data.resize( data_count );
                    event.copy_data( &data[0], 0, data_count );
                    if ( data[ data_count - 1 ] == 0xF7 )
                    {
                        uint32_t system_exclusive_index = p_system_exclusive.add_entry( &data[0], data_count, port_numbers[ next_track ] );
                        p_stream.push_back( midi_stream_event( timestamp_ms, system_exclusive_index | 0x80000000 ) );
                    }
                }
                else if ( data_count >= 3 && event.m_data[ 0 ] == 0xFF )
                {
                    if ( event.m_data[ 1 ] == 4 || event.m_data[ 1 ] == 9 )
                    {
                        unsigned long _data_count = event.get_data_count() - 2;
                        data.resize( _data_count );
                        event.copy_data( &data[0], 2, _data_count );
                        device_names[ next_track ].clear();
                        device_names[ next_track ].assign( data.begin(), data.begin() + _data_count );
                        std::transform( device_names[ next_track ].begin(), device_names[ next_track ].end(), device_names[ next_track ].begin(), ::tolower );
                    }
                    else if ( event.m_data[ 1 ] == 0x21 )
                    {
                        port_numbers[ next_track ] = event.m_data[ 2 ];
                        device_names[ next_track ].clear();
                        limit_port_number( port_numbers[ next_track ] );
                    }
                }
                else if ( data_count == 1 && event.m_data[ 0 ] >= 0xF8 )
                {
                    if ( device_names[ next_track ].length() )
                    {
                        unsigned long i, j;
                        for ( i = 0, j = m_device_names[ event.m_channel ].size(); i < j; ++i )
                        {
                            if ( !strcmp( m_device_names[ event.m_channel ][ i ].c_str(), device_names[ next_track ].c_str() ) ) break;
                        }
                        port_numbers[ next_track ] = (uint8_t) i;
                        device_names[ next_track ].clear();
                        limit_port_number( port_numbers[ next_track ] );
                    }

                    uint32_t event_code = port_numbers[ next_track ] << 24;
                    event_code += event.m_data[ 0 ];
                    p_stream.push_back( midi_stream_event( timestamp_ms, event_code ) );
                }
            }
        }

        track_positions[ next_track ]++;
    }

    loop_start = local_loop_start;
    loop_end = local_loop_end;
}